

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathNsLookup(xmlXPathContextPtr ctxt,xmlChar *prefix)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  xmlChar *pxVar5;
  long lVar6;
  xmlNsPtr pxVar3;
  
  if (prefix == (xmlChar *)0x0 || ctxt == (xmlXPathContextPtr)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    iVar2 = xmlStrEqual(prefix,(xmlChar *)"xml");
    pxVar3 = (xmlNsPtr)CONCAT44(extraout_var,iVar2);
    if (iVar2 == 0) {
      if (ctxt->namespaces != (xmlNsPtr *)0x0) {
        bVar1 = 0 < ctxt->nsNr;
        if (0 < ctxt->nsNr) {
          lVar6 = 0;
          do {
            pxVar3 = ctxt->namespaces[lVar6];
            if (pxVar3 != (xmlNsPtr)0x0) {
              iVar2 = xmlStrEqual(pxVar3->prefix,prefix);
              pxVar3 = (xmlNsPtr)CONCAT44(extraout_var_00,iVar2);
              if (iVar2 != 0) {
                pxVar3 = (xmlNsPtr)ctxt->namespaces[lVar6]->href;
                break;
              }
            }
            lVar6 = lVar6 + 1;
            bVar1 = lVar6 < ctxt->nsNr;
          } while (lVar6 < ctxt->nsNr);
        }
        if (bVar1) {
          return (xmlChar *)pxVar3;
        }
      }
      pxVar5 = (xmlChar *)xmlHashLookup(ctxt->nsHash,prefix);
      return pxVar5;
    }
    pcVar4 = "http://www.w3.org/XML/1998/namespace";
  }
  return (xmlChar *)pcVar4;
}

Assistant:

const xmlChar *
xmlXPathNsLookup(xmlXPathContextPtr ctxt, const xmlChar *prefix) {
    if (ctxt == NULL)
	return(NULL);
    if (prefix == NULL)
	return(NULL);

    if (xmlStrEqual(prefix, (const xmlChar *) "xml"))
	return(XML_XML_NAMESPACE);

    if (ctxt->namespaces != NULL) {
	int i;

	for (i = 0;i < ctxt->nsNr;i++) {
	    if ((ctxt->namespaces[i] != NULL) &&
		(xmlStrEqual(ctxt->namespaces[i]->prefix, prefix)))
		return(ctxt->namespaces[i]->href);
	}
    }

    return((const xmlChar *) xmlHashLookup(ctxt->nsHash, prefix));
}